

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_test.cc
# Opt level: O2

void __thiscall
phmap::priv::
base_checker<phmap::btree_set<long,_phmap::Less<long>,_std::allocator<long>_>,_std::set<long,_std::less<long>,_std::allocator<long>_>_>
::value_check(base_checker<phmap::btree_set<long,_phmap::Less<long>,_std::allocator<long>_>,_std::set<long,_std::less<long>,_std::allocator<long>_>_>
              *this,value_type *x)

{
  template_ElementType<2UL> *ptVar1;
  iterator iVar2;
  pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>,_long_&,_long_*>,_phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>,_long_&,_long_*>_>
  pStack_38;
  
  iVar2 = find(this,x);
  ptVar1 = btree_node<phmap::priv::set_params<long,phmap::Less<long>,std::allocator<long>,256,false>>
           ::GetField<2ul>((btree_node<phmap::priv::set_params<long,phmap::Less<long>,std::allocator<long>,256,false>>
                            *)iVar2.node);
  (anonymous_namespace)::CheckPairEquals<long,long>(ptVar1 + iVar2.position,x);
  lower_bound(this,x);
  upper_bound(this,x);
  equal_range(&pStack_38,this,x);
  contains(this,x);
  count(this,x);
  return;
}

Assistant:

void value_check(const value_type &x) {
        typename KeyOfValue<typename TreeType::key_type,
                            typename TreeType::value_type>::type key_of_value;
        const key_type &key = key_of_value(x);
        CheckPairEquals(*find(key), x);
        lower_bound(key);
        upper_bound(key);
        equal_range(key);
        contains(key);
        count(key);
    }